

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred_ssse3.c
# Opt level: O1

void aom_smooth_h_predictor_8x8_ssse3
               (uint8_t *dst,ptrdiff_t stride,uint8_t *top_row,uint8_t *left_column)

{
  ulong uVar1;
  undefined1 auVar2 [15];
  undefined1 auVar3 [15];
  undefined1 auVar4 [15];
  undefined1 auVar5 [15];
  undefined1 auVar6 [15];
  undefined1 auVar7 [15];
  undefined1 auVar8 [15];
  undefined1 auVar9 [15];
  undefined1 auVar10 [15];
  uint uVar11;
  short sVar12;
  short sVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  ushort uVar16;
  ushort uVar17;
  ushort uVar18;
  ushort uVar19;
  ushort uVar20;
  ushort uVar21;
  ushort uVar22;
  ushort uVar23;
  ushort uVar24;
  ushort uVar25;
  ushort uVar26;
  ushort uVar27;
  ushort uVar28;
  ushort uVar29;
  ushort uVar30;
  ushort uVar31;
  
  auVar13 = pshuflw(ZEXT116(top_row[7]),ZEXT116(top_row[7]),0);
  uVar1 = *(ulong *)left_column;
  auVar2._8_6_ = 0;
  auVar2._0_8_ = uVar1;
  auVar2[0xe] = (char)(uVar1 >> 0x38);
  auVar3._8_4_ = 0;
  auVar3._0_8_ = uVar1;
  auVar3[0xc] = (char)(uVar1 >> 0x30);
  auVar3._13_2_ = auVar2._13_2_;
  auVar4._8_4_ = 0;
  auVar4._0_8_ = uVar1;
  auVar4._12_3_ = auVar3._12_3_;
  auVar5._8_2_ = 0;
  auVar5._0_8_ = uVar1;
  auVar5[10] = (char)(uVar1 >> 0x28);
  auVar5._11_4_ = auVar4._11_4_;
  auVar6._8_2_ = 0;
  auVar6._0_8_ = uVar1;
  auVar6._10_5_ = auVar5._10_5_;
  auVar7[8] = (char)(uVar1 >> 0x20);
  auVar7._0_8_ = uVar1;
  auVar7._9_6_ = auVar6._9_6_;
  auVar8._7_8_ = 0;
  auVar8._0_7_ = auVar7._8_7_;
  auVar9._1_8_ = SUB158(auVar8 << 0x40,7);
  auVar9[0] = (char)(uVar1 >> 0x18);
  auVar9._9_6_ = 0;
  auVar10._1_10_ = SUB1510(auVar9 << 0x30,5);
  auVar10[0] = (char)(uVar1 >> 0x10);
  auVar10._11_4_ = 0;
  auVar15._3_12_ = SUB1512(auVar10 << 0x20,3);
  auVar15[2] = (char)(uVar1 >> 8);
  auVar15[0] = (byte)uVar1;
  auVar15[1] = 0;
  auVar15[0xf] = 0;
  sVar12 = auVar13._0_2_;
  sVar14 = auVar13._2_2_;
  uVar11 = 0xfefdfefe;
  do {
    uVar11 = uVar11 + 0x2020202;
    auVar13._4_4_ = uVar11;
    auVar13._0_4_ = uVar11;
    auVar13._8_4_ = uVar11;
    auVar13._12_4_ = uVar11;
    auVar13 = pshufb(auVar15,auVar13);
    uVar16 = auVar13._0_2_ * 0xff + sVar12 + 0x80;
    uVar18 = auVar13._2_2_ * 0xc5 + sVar14 * 0x3b + 0x80;
    uVar20 = auVar13._4_2_ * 0x92 + sVar12 * 0x6e + 0x80;
    uVar22 = auVar13._6_2_ * 0x69 + sVar14 * 0x97 + 0x80;
    uVar24 = auVar13._8_2_ * 0x49 + sVar12 * 0xb7 + 0x80;
    uVar26 = auVar13._10_2_ * 0x32 + sVar14 * 0xce + 0x80;
    uVar28 = auVar13._12_2_ * 0x25 + sVar12 * 0xdb + 0x80;
    uVar30 = auVar13._14_2_ * 0x20 + sVar14 * 0xe0 + 0x80;
    uVar17 = uVar16 >> 8;
    uVar19 = uVar18 >> 8;
    uVar21 = uVar20 >> 8;
    uVar23 = uVar22 >> 8;
    uVar25 = uVar24 >> 8;
    uVar27 = uVar26 >> 8;
    uVar29 = uVar28 >> 8;
    uVar31 = uVar30 >> 8;
    *(ulong *)dst =
         CONCAT17((uVar31 != 0) * (uVar31 < 0x100) * (char)(uVar30 >> 8) - (0xff < uVar31),
                  CONCAT16((uVar29 != 0) * (uVar29 < 0x100) * (char)(uVar28 >> 8) - (0xff < uVar29),
                           CONCAT15((uVar27 != 0) * (uVar27 < 0x100) * (char)(uVar26 >> 8) -
                                    (0xff < uVar27),
                                    CONCAT14((uVar25 != 0) * (uVar25 < 0x100) * (char)(uVar24 >> 8)
                                             - (0xff < uVar25),
                                             CONCAT13((uVar23 != 0) * (uVar23 < 0x100) *
                                                      (char)(uVar22 >> 8) - (0xff < uVar23),
                                                      CONCAT12((uVar21 != 0) * (uVar21 < 0x100) *
                                                               (char)(uVar20 >> 8) - (0xff < uVar21)
                                                               ,CONCAT11((uVar19 != 0) *
                                                                         (uVar19 < 0x100) *
                                                                         (char)(uVar18 >> 8) -
                                                                         (0xff < uVar19),
                                                                         (uVar17 != 0) *
                                                                         (uVar17 < 0x100) *
                                                                         (char)(uVar16 >> 8) -
                                                                         (0xff < uVar17))))))));
    dst = dst + stride;
  } while (uVar11 < 0xd0c0d0d);
  return;
}

Assistant:

void aom_smooth_h_predictor_8x8_ssse3(
    uint8_t *LIBAOM_RESTRICT dst, ptrdiff_t stride,
    const uint8_t *LIBAOM_RESTRICT top_row,
    const uint8_t *LIBAOM_RESTRICT left_column) {
  const __m128i top_right = _mm_set1_epi16(top_row[7]);
  const __m128i left = cvtepu8_epi16(LoadLo8(left_column));
  const __m128i weights = cvtepu8_epi16(LoadLo8(smooth_weights + 4));
  const __m128i scale = _mm_set1_epi16(1 << SMOOTH_WEIGHT_LOG2_SCALE);
  const __m128i inverted_weights = _mm_sub_epi16(scale, weights);
  const __m128i scaled_top_right = _mm_mullo_epi16(inverted_weights, top_right);
  const __m128i round = _mm_set1_epi16(1 << (SMOOTH_WEIGHT_LOG2_SCALE - 1));
  for (int y_mask = 0x01000100; y_mask < 0x0F0E0F0F; y_mask += 0x02020202) {
    const __m128i y_select = _mm_set1_epi32(y_mask);
    const __m128i left_y = _mm_shuffle_epi8(left, y_select);
    write_smooth_directional_sum8(dst, &left_y, &weights, &scaled_top_right,
                                  &round);
    dst += stride;
  }
}